

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O0

sFace * __thiscall gjkepa2_impl::EPA::newface(EPA *this,sSV *a,sSV *b,sSV *c,bool forced)

{
  byte bVar1;
  bool bVar2;
  sSV *in_RCX;
  sFace *in_RDX;
  EPA *in_RSI;
  btVector3 *in_RDI;
  byte in_R8B;
  btScalar bVar3;
  btScalar bVar4;
  btVector3 bVar5;
  bool v;
  btScalar l;
  sFace *face;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff94;
  undefined1 in_stack_ffffffffffffff98 [16];
  undefined8 local_48;
  undefined8 local_40;
  sFace *face_00;
  undefined7 in_stack_ffffffffffffffd0;
  
  bVar1 = in_R8B & 1;
  if (*(long *)in_RDI[0x387].m_floats == 0) {
    bVar3 = 7.00649e-45;
    if (*(long *)in_RDI[0x387].m_floats != 0) {
      bVar3 = 8.40779e-45;
    }
    in_RDI->m_floats[0] = bVar3;
  }
  else {
    face_00 = *(sFace **)in_RDI[0x387].m_floats;
    remove((EPA *)(in_RDI + 0x387),(char *)face_00);
    append((sList *)(in_RDI + 0x386),face_00);
    face_00->pass = '\0';
    face_00->c[0] = (sSV *)in_RSI;
    face_00->c[1] = (sSV *)in_RDX;
    face_00->c[2] = in_RCX;
    operator-(in_stack_ffffffffffffff98._8_8_,in_stack_ffffffffffffff98._0_8_);
    operator-(in_stack_ffffffffffffff98._8_8_,in_stack_ffffffffffffff98._0_8_);
    bVar5 = btCross((btVector3 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    in_RDI);
    local_48 = bVar5.m_floats._0_8_;
    *(undefined8 *)(face_00->n).m_floats = local_48;
    local_40 = bVar5.m_floats._8_8_;
    *(undefined8 *)((face_00->n).m_floats + 2) = local_40;
    bVar3 = btVector3::length((btVector3 *)0x1e8de5);
    uVar6 = CONCAT13(0.0001 < bVar3,(int3)in_stack_ffffffffffffff90);
    if (0.0001 < bVar3) {
      bVar2 = getedgedist(in_RSI,in_RDX,in_RCX,(sSV *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),
                          (btScalar *)face_00);
      if (((!bVar2) &&
          (bVar2 = getedgedist(in_RSI,in_RDX,in_RCX,(sSV *)CONCAT17(bVar1,in_stack_ffffffffffffffd0)
                               ,(btScalar *)face_00), !bVar2)) &&
         (bVar2 = getedgedist(in_RSI,in_RDX,in_RCX,(sSV *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),
                              (btScalar *)face_00), !bVar2)) {
        bVar4 = btDot((btVector3 *)CONCAT44(bVar3,uVar6),in_RDI);
        face_00->d = bVar4 / bVar3;
      }
      btVector3::operator/=((btVector3 *)CONCAT44(bVar3,uVar6),in_RDI->m_floats);
      if ((bVar1 & 1) != 0) {
        return face_00;
      }
      if (-1e-05 <= face_00->d) {
        return face_00;
      }
      in_RDI->m_floats[0] = 4.2039e-45;
    }
    else {
      in_RDI->m_floats[0] = 2.8026e-45;
    }
    remove((EPA *)(in_RDI + 0x386),(char *)face_00);
    append((sList *)(in_RDI + 0x387),face_00);
  }
  return (sFace *)0x0;
}

Assistant:

sFace*				newface(sSV* a,sSV* b,sSV* c,bool forced)
			{
				if(m_stock.root)
				{
					sFace*	face=m_stock.root;
					remove(m_stock,face);
					append(m_hull,face);
					face->pass	=	0;
					face->c[0]	=	a;
					face->c[1]	=	b;
					face->c[2]	=	c;
					face->n		=	btCross(b->w-a->w,c->w-a->w);
					const btScalar	l=face->n.length();
					const bool		v=l>EPA_ACCURACY;

					if(v)
					{
						if(!(getedgedist(face, a, b, face->d) ||
							 getedgedist(face, b, c, face->d) ||
							 getedgedist(face, c, a, face->d)))
						{
							// Origin projects to the interior of the triangle
							// Use distance to triangle plane
							face->d = btDot(a->w, face->n) / l;
						}

						face->n /= l;
						if(forced || (face->d >= -EPA_PLANE_EPS))
						{
							return face;
						}
						else
							m_status=eStatus::NonConvex;
					}
					else
						m_status=eStatus::Degenerated;

					remove(m_hull, face);
					append(m_stock, face);
					return 0;

				}
				m_status = m_stock.root ? eStatus::OutOfVertices : eStatus::OutOfFaces;
				return 0;
			}